

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::FCmpInst>::run(TypedDeleter<LLVMBC::FCmpInst> *this)

{
  Instruction::~Instruction((Instruction *)this->ptr);
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}